

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzeArrayIndex(ExpressionContext *ctx,SynArrayIndex *syntax)

{
  SynBase *pSVar1;
  SynIdentifier *pSVar2;
  long lVar3;
  ArgumentData *pAVar4;
  int iVar5;
  ExprBase *value;
  ExprBase *pEVar6;
  undefined4 extraout_var;
  TypeBase *pTVar7;
  ExprError *this;
  undefined4 extraout_var_00;
  long lVar8;
  char *__function;
  ulong uVar9;
  SynCallArgument *pSVar10;
  Allocator *pAVar11;
  uint i;
  ulong uVar12;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ExprBase_*> arr;
  ArrayView<ExprBase_*> arr_00;
  SmallArray<ArgumentData,_32U> arguments;
  SmallArray<ExprBase_*,_8U> local_6a0;
  SmallArray<ArgumentData,_32U> local_648;
  
  value = AnalyzeExpression(ctx,syntax->value);
  local_648.allocator = ctx->allocator;
  lVar8 = 0x20;
  do {
    *(undefined8 *)((long)local_6a0.little + lVar8 + 0x38) = 0;
    *(undefined1 *)((long)local_6a0.little + lVar8 + 0x40) = 0;
    *(undefined8 *)((long)local_648.little + lVar8 + -0x10) = 0;
    *(undefined8 *)((long)local_648.little + lVar8 + -8) = 0;
    *(undefined8 *)((long)&local_648.little[0].source + lVar8) = 0;
    *(undefined8 *)(&local_648.little[0].isExplicit + lVar8) = 0;
    lVar8 = lVar8 + 0x30;
  } while (lVar8 != 0x620);
  local_648.data = local_648.little;
  local_648.count = 0;
  local_648.max = 0x20;
  pSVar10 = (syntax->arguments).head;
  if (pSVar10 != (SynCallArgument *)0x0) {
    do {
      pEVar6 = AnalyzeExpression(ctx,pSVar10->value);
      pSVar1 = pEVar6->source;
      pTVar7 = pEVar6->type;
      pSVar2 = pSVar10->name;
      if (local_648.count == local_648.max) {
        SmallArray<ArgumentData,_32U>::grow(&local_648,local_648.count);
      }
      if (local_648.data == (ArgumentData *)0x0) {
        __function = 
        "void SmallArray<ArgumentData, 32>::push_back(const T &) [T = ArgumentData, N = 32]";
        goto LAB_0015c38c;
      }
      uVar12 = (ulong)local_648.count;
      local_648.count = local_648.count + 1;
      local_648.data[uVar12].source = pSVar1;
      local_648.data[uVar12].isExplicit = false;
      local_648.data[uVar12].name = pSVar2;
      local_648.data[uVar12].type = pTVar7;
      local_648.data[uVar12].value = pEVar6;
      local_648.data[uVar12].valueFunction = (FunctionData *)0x0;
      pSVar10 = (SynCallArgument *)(pSVar10->super_SynBase).next;
    } while ((pSVar10 != (SynCallArgument *)0x0) && ((pSVar10->super_SynBase).typeID == 0x18));
  }
  if ((value->type == (TypeBase *)0x0) || (value->type->typeID != 0)) {
    if (local_648.count != 0) {
      lVar8 = 0;
      do {
        lVar3 = *(long *)(*(long *)((long)&(local_648.data)->value + lVar8) + 0x18);
        if ((lVar3 != 0) && (*(int *)(lVar3 + 8) == 0)) {
          local_6a0.allocator = ctx->allocator;
          local_6a0.data = local_6a0.little;
          local_6a0.count = 1;
          local_6a0.max = 8;
          lVar8 = 0x20;
          uVar12 = 0;
          local_6a0.little[0] = value;
          do {
            pAVar4 = local_648.data;
            if (local_6a0.count == local_6a0.max) {
              SmallArray<ExprBase_*,_8U>::grow(&local_6a0,local_6a0.count);
            }
            if (local_6a0.data == (ExprBase **)0x0) {
LAB_0015c360:
              __function = 
              "void SmallArray<ExprBase *, 8>::push_back(const T &) [T = ExprBase *, N = 8]";
LAB_0015c38c:
              __assert_fail("data",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x162,__function);
            }
            uVar9 = (ulong)local_6a0.count;
            local_6a0.count = local_6a0.count + 1;
            local_6a0.data[uVar9] = *(ExprBase **)((long)&pAVar4->source + lVar8);
            uVar12 = uVar12 + 1;
            lVar8 = lVar8 + 0x30;
          } while (uVar12 < local_648.count);
          iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
          this = (ExprError *)CONCAT44(extraout_var_00,iVar5);
          pAVar11 = ctx->allocator;
          pTVar7 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
          arr_00.count = local_6a0.count;
          arr_00.data = local_6a0.data;
          arr_00._12_4_ = 0;
          ExprError::ExprError(this,pAVar11,&syntax->super_SynBase,pTVar7,arr_00);
          goto LAB_0015c337;
        }
        lVar8 = lVar8 + 0x30;
      } while ((ulong)local_648.count * 0x30 != lVar8);
    }
    arguments_00.count = local_648.count;
    arguments_00.data = local_648.data;
    arguments_00._12_4_ = 0;
    this = (ExprError *)CreateArrayIndex(ctx,&syntax->super_SynBase,value,arguments_00);
  }
  else {
    pAVar11 = ctx->allocator;
    local_6a0.data = local_6a0.little;
    local_6a0.count = 1;
    local_6a0.max = 8;
    local_6a0.little[0] = value;
    local_6a0.allocator = pAVar11;
    if (local_648.count != 0) {
      lVar8 = 0x20;
      uVar12 = 0;
      do {
        pAVar4 = local_648.data;
        if (local_6a0.count == local_6a0.max) {
          SmallArray<ExprBase_*,_8U>::grow(&local_6a0,local_6a0.count);
        }
        if (local_6a0.data == (ExprBase **)0x0) goto LAB_0015c360;
        uVar9 = (ulong)local_6a0.count;
        local_6a0.count = local_6a0.count + 1;
        local_6a0.data[uVar9] = *(ExprBase **)((long)&pAVar4->source + lVar8);
        uVar12 = uVar12 + 1;
        lVar8 = lVar8 + 0x30;
      } while (uVar12 < local_648.count);
      pAVar11 = ctx->allocator;
    }
    iVar5 = (*pAVar11->_vptr_Allocator[2])(pAVar11,0x68);
    this = (ExprError *)CONCAT44(extraout_var,iVar5);
    pAVar11 = ctx->allocator;
    pTVar7 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    arr.count = local_6a0.count;
    arr.data = local_6a0.data;
    arr._12_4_ = 0;
    ExprError::ExprError(this,pAVar11,&syntax->super_SynBase,pTVar7,arr);
LAB_0015c337:
    SmallArray<ExprBase_*,_8U>::~SmallArray(&local_6a0);
  }
  SmallArray<ArgumentData,_32U>::~SmallArray(&local_648);
  return &this->super_ExprBase;
}

Assistant:

ExprBase* AnalyzeArrayIndex(ExpressionContext &ctx, SynArrayIndex *syntax)
{
	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	SmallArray<ArgumentData, 32> arguments(ctx.allocator);

	for(SynCallArgument *curr = syntax->arguments.head; curr; curr = getType<SynCallArgument>(curr->next))
	{
		ExprBase *index = AnalyzeExpression(ctx, curr->value);

		arguments.push_back(ArgumentData(index->source, false, curr->name, index->type, index));
	}

	if(isType<TypeError>(value->type))
	{
		SmallArray<ExprBase*, 8> values(ctx.allocator);

		values.push_back(value);

		for(unsigned i = 0; i < arguments.size(); i++)
			values.push_back(arguments[i].value);

		return new (ctx.get<ExprError>()) ExprError(ctx.allocator, syntax, ctx.GetErrorType(), values);
	}

	for(unsigned i = 0; i < arguments.size(); i++)
	{
		if(isType<TypeError>(arguments[i].value->type))
		{
			SmallArray<ExprBase*, 8> values(ctx.allocator);

			values.push_back(value);

			for(unsigned i = 0; i < arguments.size(); i++)
				values.push_back(arguments[i].value);

			return new (ctx.get<ExprError>()) ExprError(ctx.allocator, syntax, ctx.GetErrorType(), values);
		}
	}

	return CreateArrayIndex(ctx, syntax, value, arguments);
}